

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20HM303DLHC.cpp
# Opt level: O3

bool __thiscall RTIMUGD20HM303DLHC::IMUInit(RTIMUGD20HM303DLHC *this)

{
  bool bVar1;
  undefined8 in_RAX;
  uchar result;
  uchar local_11;
  
  local_11 = (uchar)((ulong)in_RAX >> 0x38);
  (this->super_RTIMU).m_imuData.fusionPoseValid = false;
  (this->super_RTIMU).m_imuData.fusionQPoseValid = false;
  (this->super_RTIMU).m_imuData.gyroValid = true;
  (this->super_RTIMU).m_imuData.accelValid = true;
  (this->super_RTIMU).m_imuData.compassValid = true;
  (this->super_RTIMU).m_imuData.pressureValid = false;
  (this->super_RTIMU).m_imuData.temperatureValid = false;
  (this->super_RTIMU).m_imuData.humidityValid = false;
  this->m_gyroSlaveAddr = ((this->super_RTIMU).m_settings)->m_I2CSlaveAddress;
  this->m_accelSlaveAddr = '\x19';
  this->m_compassSlaveAddr = '\x1e';
  RTIMU::setCalibrationData(&this->super_RTIMU);
  bVar1 = RTIMUHal::HALOpen(&((this->super_RTIMU).m_settings)->super_RTIMUHal);
  if (!bVar1) {
    return false;
  }
  bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_gyroSlaveAddr
                             ,'9','\x04',"Failed to reset L3GD20H");
  if (((bVar1) &&
      (bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                  this->m_gyroSlaveAddr,'$',0x80,"Failed to boot L3GD20H"), bVar1))
     && (bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                   this->m_gyroSlaveAddr,'\x0f','\x01',&local_11,
                                   "Failed to read L3GD20H id"), bVar1)) {
    if (local_11 != 0xd7) {
      fprintf(_stderr,"Incorrect L3GD20H id %d\n");
      return false;
    }
    bVar1 = setGyroSampleRate(this);
    if (((((bVar1) && (bVar1 = setGyroCTRL2(this), bVar1)) &&
         ((bVar1 = setGyroCTRL4(this), bVar1 &&
          ((bVar1 = setAccelCTRL1(this), bVar1 && (bVar1 = setAccelCTRL4(this), bVar1)))))) &&
        (bVar1 = setCompassCRA(this), bVar1)) && (bVar1 = setCompassCRB(this), bVar1)) {
      bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                 this->m_compassSlaveAddr,'\x02','\0',
                                 "Failed to set LSM303DLHC CRM_M");
      if (!bVar1) {
        return false;
      }
      bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                 this->m_gyroSlaveAddr,'$','\x10',"Failed to set L3GD20H CTRL5");
      if (bVar1) {
        RTIMU::gyroBiasInit(&this->super_RTIMU);
        puts("GD20HM303DLHC init complete");
        fflush(_stdout);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool RTIMUGD20HM303DLHC::IMUInit()
{
    unsigned char result;

#ifdef GD20HM303DLHC_CACHE_MODE
    m_firstTime = true;
    m_cacheIn = m_cacheOut = m_cacheCount = 0;
#endif
    // set validity flags

    m_imuData.fusionPoseValid = false;
    m_imuData.fusionQPoseValid = false;
    m_imuData.gyroValid = true;
    m_imuData.accelValid = true;
    m_imuData.compassValid = true;
    m_imuData.pressureValid = false;
    m_imuData.temperatureValid = false;
    m_imuData.humidityValid = false;

    //  configure IMU

    m_gyroSlaveAddr = m_settings->m_I2CSlaveAddress;
    m_accelSlaveAddr = LSM303DLHC_ACCEL_ADDRESS;
    m_compassSlaveAddr = LSM303DLHC_COMPASS_ADDRESS;

    setCalibrationData();

    //  enable the I2C bus

    if (!m_settings->HALOpen())
        return false;

    //  Set up the gyro

    if (!m_settings->HALWrite(m_gyroSlaveAddr, L3GD20H_LOW_ODR, 0x04, "Failed to reset L3GD20H"))
        return false;

    if (!m_settings->HALWrite(m_gyroSlaveAddr, L3GD20H_CTRL5, 0x80, "Failed to boot L3GD20H"))
        return false;

    if (!m_settings->HALRead(m_gyroSlaveAddr, L3GD20H_WHO_AM_I, 1, &result, "Failed to read L3GD20H id"))
        return false;

    if (result != L3GD20H_ID) {
        HAL_ERROR1("Incorrect L3GD20H id %d\n", result);
        return false;
    }

    if (!setGyroSampleRate())
            return false;

    if (!setGyroCTRL2())
            return false;

    if (!setGyroCTRL4())
            return false;

    //  Set up the accel

    if (!setAccelCTRL1())
        return false;

    if (!setAccelCTRL4())
        return false;

    //  Set up the compass

    if (!setCompassCRA())
        return false;

    if (!setCompassCRB())
        return false;

    if (!setCompassCRM())
        return false;

#ifdef GD20HM303DLHC_CACHE_MODE

    //  turn on gyro fifo

    if (!m_settings->HALWrite(m_gyroSlaveAddr, L3GD20_FIFO_CTRL, 0x3f, "Failed to set L3GD20 FIFO mode"))
        return false;
#endif

    if (!setGyroCTRL5())
            return false;

    gyroBiasInit();

    HAL_INFO("GD20HM303DLHC init complete\n");
    return true;
}